

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.c
# Opt level: O3

int json_object_object_get_ex(json_object *jso,char *key,json_object **value)

{
  json_bool jVar1;
  
  if (value != (json_object **)0x0) {
    *value = (json_object *)0x0;
  }
  if (jso != (json_object *)0x0) {
    if (jso->o_type == json_type_object) {
      jVar1 = lh_table_lookup_ex(*(lh_table **)(jso + 1),key,value);
      return jVar1;
    }
    if (value != (json_object **)0x0) {
      *value = (json_object *)0x0;
    }
  }
  return 0;
}

Assistant:

json_bool json_object_object_get_ex(const struct json_object *jso, const char *key,
                                    struct json_object **value)
{
	if (value != NULL)
		*value = NULL;

	if (NULL == jso)
		return 0;

	switch (jso->o_type)
	{
	case json_type_object:
		return lh_table_lookup_ex(JC_OBJECT_C(jso)->c_object, (const void *)key,
		                          (void **)value);
	default:
		if (value != NULL)
			*value = NULL;
		return 0;
	}
}